

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_avx512_functor::binary_op_ratan2>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  __m512 x;
  undefined8 uVar29;
  undefined8 uVar30;
  __m512 y;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  int iVar81;
  int in_ECX;
  undefined1 (*in_RDX) [64];
  uint *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  __m128 _outp_2;
  __m128 _p_2;
  __m128 _b;
  __m256 _outp_1;
  __m256 _p_1;
  __m256 _b_avx;
  __m512 _outp;
  __m512 _p;
  __m512 _b_avx512;
  int i;
  int size;
  binary_op_ratan2 op;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_1;
  __m128 negative_mask_full_x_1;
  __m128 normal_result_1;
  __m128 pi_additions_1;
  __m128 negative_mask_y_1;
  __m128 negative_mask_x_1;
  __m128 normal_mode_1;
  __m128 not_equal_zero_y_1;
  __m128 not_equal_zero_x_1;
  __m128 magic_half_pi_2;
  __m128 magic_pi_1;
  __m128 magic_negative_zero_2;
  __m128 magic_zero_1;
  __m128 output_approx_1;
  __m128 fourth_power_of_input_approx_1;
  __m128 square_of_input_approx_1;
  __m128 input_approx_1;
  __m128 is_small_input_1;
  __m128 absolute_1;
  __m128 negative_mask_1;
  __m128 magic_a8_1;
  __m128 magic_a7_1;
  __m128 magic_a6_1;
  __m128 magic_a5_1;
  __m128 magic_a4_1;
  __m128 magic_a3_1;
  __m128 magic_a2_1;
  __m128 magic_a1_1;
  __m128 magic_a0_1;
  __m128 magic_half_pi_3;
  __m128 magic_negative_one_1;
  __m128 magic_one_1;
  __m128 magic_negative_zero_3;
  undefined8 local_2650;
  undefined8 uStackY_2648;
  undefined8 local_2620;
  undefined8 uStackY_2618;
  undefined8 uStackY_2610;
  undefined8 uStackY_2608;
  undefined8 local_2540;
  undefined8 uStackY_2538;
  undefined8 uStackY_2530;
  undefined8 uStackY_2528;
  undefined8 uStackY_2520;
  undefined8 uStackY_2518;
  undefined8 uStackY_2510;
  undefined8 uStackY_2508;
  int local_24f4;
  undefined1 (*local_24e0) [64];
  undefined1 (*local_24d0) [32];
  undefined8 in_stack_ffffffffffffdbf8;
  undefined8 in_stack_ffffffffffffdc00;
  undefined8 in_stack_ffffffffffffdc08;
  undefined8 in_stack_ffffffffffffdc10;
  undefined8 in_stack_ffffffffffffdc18;
  undefined4 in_stack_ffffffffffffdc20;
  undefined4 in_stack_ffffffffffffdc24;
  undefined4 in_stack_ffffffffffffdc28;
  undefined4 in_stack_ffffffffffffdc2c;
  undefined8 in_stack_ffffffffffffdc30;
  undefined4 in_stack_ffffffffffffdc38;
  undefined4 in_stack_ffffffffffffdc3c;
  undefined1 auVar99 [56];
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  float local_2100;
  float fStack_20fc;
  float fStack_20f8;
  float fStack_20f4;
  float fStack_20f0;
  float fStack_20ec;
  float fStack_20e8;
  float fStack_20e4;
  float local_20e0;
  float fStack_20dc;
  float fStack_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float fStack_20c8;
  float fStack_20c4;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  float local_1860;
  float fStack_185c;
  float fStack_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float fStack_1848;
  float fStack_1844;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  float local_1480;
  float fStack_147c;
  float fStack_1478;
  float fStack_1474;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  float local_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float local_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  
  iVar81 = in_ECX * in_R8D;
  local_24f4 = 0;
  auVar84 = vbroadcastss_avx512f(ZEXT416(*in_RSI));
  auVar99 = auVar84._0_56_;
  local_24e0 = in_RDX;
  local_24d0 = in_RDI;
  for (; local_24f4 + 0xf < iVar81; local_24f4 = local_24f4 + 0x10) {
    local_2540 = auVar84._0_8_;
    uStackY_2538 = auVar84._8_8_;
    uStackY_2530 = auVar84._16_8_;
    uStackY_2528 = auVar84._24_8_;
    uStackY_2520 = auVar84._32_8_;
    uStackY_2518 = auVar84._40_8_;
    uStackY_2510 = auVar84._48_8_;
    uStackY_2508 = auVar84._56_8_;
    y[1] = (float)in_stack_ffffffffffffdc3c;
    y[0] = (float)in_stack_ffffffffffffdc38;
    y[2] = (float)auVar99._0_4_;
    y[3] = (float)auVar99._4_4_;
    y[4] = (float)auVar99._8_4_;
    y[5] = (float)auVar99._12_4_;
    y[6] = (float)auVar99._16_4_;
    y[7] = (float)auVar99._20_4_;
    y[8] = (float)auVar99._24_4_;
    y[9] = (float)auVar99._28_4_;
    y[10] = (float)auVar99._32_4_;
    y[0xb] = (float)auVar99._36_4_;
    y[0xc] = (float)auVar99._40_4_;
    y[0xd] = (float)auVar99._44_4_;
    y[0xe] = (float)auVar99._48_4_;
    y[0xf] = (float)auVar99._52_4_;
    x[2] = (float)(int)in_stack_ffffffffffffdc00;
    x[3] = (float)(int)((ulong)in_stack_ffffffffffffdc00 >> 0x20);
    x[0] = (float)(int)in_stack_ffffffffffffdbf8;
    x[1] = (float)(int)((ulong)in_stack_ffffffffffffdbf8 >> 0x20);
    x[4] = (float)(int)in_stack_ffffffffffffdc08;
    x[5] = (float)(int)((ulong)in_stack_ffffffffffffdc08 >> 0x20);
    x[6] = (float)(int)in_stack_ffffffffffffdc10;
    x[7] = (float)(int)((ulong)in_stack_ffffffffffffdc10 >> 0x20);
    x[8] = (float)(int)in_stack_ffffffffffffdc18;
    x[9] = (float)(int)((ulong)in_stack_ffffffffffffdc18 >> 0x20);
    x[10] = (float)in_stack_ffffffffffffdc20;
    x[0xb] = (float)in_stack_ffffffffffffdc24;
    x[0xc] = (float)in_stack_ffffffffffffdc28;
    x[0xd] = (float)in_stack_ffffffffffffdc2c;
    x[0xe] = (float)(int)in_stack_ffffffffffffdc30;
    x[0xf] = (float)(int)((ulong)in_stack_ffffffffffffdc30 >> 0x20);
    atan2512_ps(y,x);
    auVar28._8_8_ = uStackY_2538;
    auVar28._0_8_ = local_2540;
    auVar28._16_8_ = uStackY_2530;
    auVar28._24_8_ = uStackY_2528;
    auVar28._32_8_ = uStackY_2520;
    auVar28._40_8_ = uStackY_2518;
    auVar28._48_8_ = uStackY_2510;
    auVar28._56_8_ = uStackY_2508;
    *local_24e0 = auVar28;
    local_24d0 = local_24d0 + 2;
    local_24e0 = local_24e0 + 1;
  }
  uVar1 = *in_RSI;
  auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
  auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
  auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
  uStack_2350 = auVar4._0_8_;
  uStack_2348 = auVar4._8_8_;
  for (; local_24f4 + 7 < iVar81; local_24f4 = local_24f4 + 8) {
    auVar46._16_8_ = uStack_2350;
    auVar46._0_16_ = auVar5;
    auVar46._24_8_ = uStack_2348;
    auVar45._16_8_ = uStack_2350;
    auVar45._0_16_ = auVar5;
    auVar45._24_8_ = uStack_2348;
    auVar44._16_8_ = uStack_2350;
    auVar44._0_16_ = auVar5;
    auVar44._24_8_ = uStack_2348;
    auVar21._16_8_ = uStack_2350;
    auVar21._0_16_ = auVar5;
    auVar21._24_8_ = uStack_2348;
    auVar4 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x30);
    auVar82 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar82 = vinsertps_avx(auVar82,ZEXT416(0),0x20);
    auVar82 = vinsertps_avx(auVar82,ZEXT416(0),0x30);
    uStack_2090 = auVar82._0_8_;
    uStack_2088 = auVar82._8_8_;
    auVar82 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar82 = vinsertps_avx(auVar82,ZEXT416(0x80000000),0x20);
    auVar82 = vinsertps_avx(auVar82,ZEXT416(0x80000000),0x30);
    auVar6 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar6 = vinsertps_avx(auVar6,ZEXT416(0x80000000),0x20);
    auVar6 = vinsertps_avx(auVar6,ZEXT416(0x80000000),0x30);
    uStack_2050 = auVar6._0_8_;
    uStack_2048 = auVar6._8_8_;
    auVar6 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar6 = vinsertps_avx(auVar6,ZEXT416(0x40490fdb),0x20);
    auVar6 = vinsertps_avx(auVar6,ZEXT416(0x40490fdb),0x30);
    auVar7 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40490fdb),0x20);
    auVar7 = vinsertps_avx(auVar7,ZEXT416(0x40490fdb),0x30);
    uStack_2010 = auVar7._0_8_;
    uStack_2008 = auVar7._8_8_;
    auVar7 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3fc90fdb),0x20);
    auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3fc90fdb),0x30);
    auVar8 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3fc90fdb),0x20);
    auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3fc90fdb),0x30);
    uStack_1fd0 = auVar8._0_8_;
    uStack_1fc8 = auVar8._8_8_;
    auVar2._16_8_ = uStack_2090;
    auVar2._0_16_ = auVar4;
    auVar2._24_8_ = uStack_2088;
    auVar2 = vcmpps_avx(*local_24d0,auVar2,4);
    auVar3._16_8_ = uStack_2090;
    auVar3._0_16_ = auVar4;
    auVar3._24_8_ = uStack_2088;
    auVar3 = vcmpps_avx(auVar21,auVar3,4);
    auVar21 = vpand_avx2(auVar2,auVar3);
    auVar27._16_8_ = uStack_2050;
    auVar27._0_16_ = auVar82;
    auVar27._24_8_ = uStack_2048;
    auVar22 = vpand_avx2(auVar27,*local_24d0);
    auVar26._16_8_ = uStack_2050;
    auVar26._0_16_ = auVar82;
    auVar26._24_8_ = uStack_2048;
    auVar23 = vpand_avx2(auVar26,auVar44);
    auVar83._16_8_ = uStack_2090;
    auVar83._0_16_ = auVar4;
    auVar83._24_8_ = uStack_2088;
    auVar2 = vcmpps_avx(*local_24d0,auVar83,1);
    auVar83 = vcmpps_avx(auVar45,auVar83,1);
    auVar25._16_8_ = uStack_2050;
    auVar25._0_16_ = auVar82;
    auVar25._24_8_ = uStack_2048;
    auVar83 = vpand_avx2(auVar83,auVar25);
    auVar33._16_8_ = uStack_2010;
    auVar33._0_16_ = auVar6;
    auVar33._24_8_ = uStack_2008;
    auVar83 = vpor_avx2(auVar83,auVar33);
    auVar24 = vpand_avx2(auVar2,auVar83);
    auVar2 = vdivps_avx(auVar46,*local_24d0);
    auVar82 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar82 = vinsertps_avx(auVar82,ZEXT416(0x80000000),0x20);
    auVar82 = vinsertps_avx(auVar82,ZEXT416(0x80000000),0x30);
    auVar8 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar8 = vinsertps_avx(auVar8,ZEXT416(0x80000000),0x20);
    auVar8 = vinsertps_avx(auVar8,ZEXT416(0x80000000),0x30);
    uStack_17d0 = auVar8._0_8_;
    uStack_17c8 = auVar8._8_8_;
    auVar8 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x20);
    auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x30);
    auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
    auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
    uStack_1790 = auVar9._0_8_;
    uStack_1788 = auVar9._8_8_;
    auVar9 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar9 = vinsertps_avx(auVar9,ZEXT416(0xbf800000),0x20);
    auVar9 = vinsertps_avx(auVar9,ZEXT416(0xbf800000),0x30);
    auVar10 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar10 = vinsertps_avx(auVar10,ZEXT416(0xbf800000),0x20);
    auVar10 = vinsertps_avx(auVar10,ZEXT416(0xbf800000),0x30);
    uStack_1750 = auVar10._0_8_;
    uStack_1748 = auVar10._8_8_;
    auVar10 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3fc90fdb),0x20);
    auVar10 = vinsertps_avx(auVar10,ZEXT416(0x3fc90fdb),0x30);
    auVar11 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3fc90fdb),0x20);
    auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3fc90fdb),0x30);
    uStack_1710 = auVar11._0_8_;
    uStack_1708 = auVar11._8_8_;
    auVar11 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3f800000),0x20);
    auVar11 = vinsertps_avx(auVar11,ZEXT416(0x3f800000),0x30);
    auVar12 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar12 = vinsertps_avx(auVar12,ZEXT416(0x3f800000),0x20);
    auVar12 = vinsertps_avx(auVar12,ZEXT416(0x3f800000),0x30);
    uStack_16d0 = auVar12._0_8_;
    uStack_16c8 = auVar12._8_8_;
    auVar12 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar12 = vinsertps_avx(auVar12,ZEXT416(0xbeaaaa53),0x20);
    auVar12 = vinsertps_avx(auVar12,ZEXT416(0xbeaaaa53),0x30);
    auVar13 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(0xbeaaaa53),0x20);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(0xbeaaaa53),0x30);
    uStack_1690 = auVar13._0_8_;
    uStack_1688 = auVar13._8_8_;
    auVar13 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(0x3e4cb974),0x20);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(0x3e4cb974),0x30);
    auVar14 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar14 = vinsertps_avx(auVar14,ZEXT416(0x3e4cb974),0x20);
    auVar14 = vinsertps_avx(auVar14,ZEXT416(0x3e4cb974),0x30);
    uStack_1650 = auVar14._0_8_;
    uStack_1648 = auVar14._8_8_;
    auVar14 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar14 = vinsertps_avx(auVar14,ZEXT416(0xbe117200),0x20);
    auVar14 = vinsertps_avx(auVar14,ZEXT416(0xbe117200),0x30);
    auVar15 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0xbe117200),0x20);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0xbe117200),0x30);
    uStack_1610 = auVar15._0_8_;
    uStack_1608 = auVar15._8_8_;
    auVar15 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3dd9ed24),0x20);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0x3dd9ed24),0x30);
    auVar16 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3dd9ed24),0x20);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x3dd9ed24),0x30);
    uStack_15d0 = auVar16._0_8_;
    uStack_15c8 = auVar16._8_8_;
    auVar16 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0xbd99b01e),0x20);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0xbd99b01e),0x30);
    auVar17 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0xbd99b01e),0x20);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0xbd99b01e),0x30);
    uStack_1590 = auVar17._0_8_;
    uStack_1588 = auVar17._8_8_;
    auVar17 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3d2edd4e),0x20);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3d2edd4e),0x30);
    auVar18 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3d2edd4e),0x20);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3d2edd4e),0x30);
    uStack_1550 = auVar18._0_8_;
    uStack_1548 = auVar18._8_8_;
    auVar18 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0xbc83a25c),0x20);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0xbc83a25c),0x30);
    auVar19 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbc83a25c),0x20);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbc83a25c),0x30);
    uStack_1510 = auVar19._0_8_;
    uStack_1508 = auVar19._8_8_;
    auVar19 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3b3ac537),0x20);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3b3ac537),0x30);
    auVar20 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3b3ac537),0x20);
    auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3b3ac537),0x30);
    uStack_14d0 = auVar20._0_8_;
    uStack_14c8 = auVar20._8_8_;
    auVar37._16_8_ = uStack_17d0;
    auVar37._0_16_ = auVar82;
    auVar37._24_8_ = uStack_17c8;
    auVar25 = vpand_avx2(auVar37,auVar2);
    auVar40._16_8_ = uStack_17d0;
    auVar40._0_16_ = auVar82;
    auVar40._24_8_ = uStack_17c8;
    auVar26 = vpandn_avx2(auVar40,auVar2);
    auVar34._16_8_ = uStack_1790;
    auVar34._0_16_ = auVar8;
    auVar34._24_8_ = uStack_1788;
    auVar2 = vcmpps_avx(auVar34,auVar26,1);
    auVar36._16_8_ = uStack_1750;
    auVar36._0_16_ = auVar9;
    auVar36._24_8_ = uStack_1748;
    auVar83 = vpand_avx2(auVar2,auVar36);
    auVar27 = vpandn_avx2(auVar2,auVar26);
    auVar27 = vpor_avx2(auVar83,auVar27);
    auVar83 = vpand_avx2(auVar2,auVar26);
    auVar39._16_8_ = uStack_1790;
    auVar39._0_16_ = auVar8;
    auVar39._24_8_ = uStack_1788;
    auVar26 = vpandn_avx2(auVar2,auVar39);
    auVar83 = vpor_avx2(auVar83,auVar26);
    auVar83 = vdivps_avx(auVar27,auVar83);
    local_1400 = auVar83._0_4_;
    fStack_13fc = auVar83._4_4_;
    fStack_13f8 = auVar83._8_4_;
    fStack_13f4 = auVar83._12_4_;
    fStack_13f0 = auVar83._16_4_;
    fStack_13ec = auVar83._20_4_;
    fStack_13e8 = auVar83._24_4_;
    fStack_13e4 = auVar83._28_4_;
    fVar85 = local_1400 * local_1400;
    fVar87 = fStack_13fc * fStack_13fc;
    fVar89 = fStack_13f8 * fStack_13f8;
    fVar91 = fStack_13f4 * fStack_13f4;
    fVar93 = fStack_13f0 * fStack_13f0;
    fVar95 = fStack_13ec * fStack_13ec;
    fVar97 = fStack_13e8 * fStack_13e8;
    fVar86 = fVar85 * fVar85;
    fVar88 = fVar87 * fVar87;
    fVar90 = fVar89 * fVar89;
    fVar92 = fVar91 * fVar91;
    fVar94 = fVar93 * fVar93;
    fVar96 = fVar95 * fVar95;
    fVar98 = fVar97 * fVar97;
    auVar47._4_4_ = fVar88;
    auVar47._0_4_ = fVar86;
    auVar47._8_4_ = fVar90;
    auVar47._12_4_ = fVar92;
    auVar47._16_4_ = fVar94;
    auVar47._20_4_ = fVar96;
    auVar47._24_4_ = fVar98;
    auVar47._28_4_ = fStack_13e4;
    auVar56._16_8_ = uStack_1510;
    auVar56._0_16_ = auVar18;
    auVar56._24_8_ = uStack_1508;
    auVar58._16_8_ = uStack_1590;
    auVar58._0_16_ = auVar16;
    auVar58._24_8_ = uStack_1588;
    auVar82 = vfmadd213ps_fma(auVar56,auVar47,auVar58);
    auVar48._4_4_ = fVar88;
    auVar48._0_4_ = fVar86;
    auVar48._8_4_ = fVar90;
    auVar48._12_4_ = fVar92;
    auVar48._16_4_ = fVar94;
    auVar48._20_4_ = fVar96;
    auVar48._24_4_ = fVar98;
    auVar48._28_4_ = fStack_13e4;
    auVar60._16_8_ = uStack_1610;
    auVar60._0_16_ = auVar14;
    auVar60._24_8_ = uStack_1608;
    auVar82 = vfmadd213ps_fma(ZEXT1632(auVar82),auVar48,auVar60);
    auVar49._4_4_ = fVar88;
    auVar49._0_4_ = fVar86;
    auVar49._8_4_ = fVar90;
    auVar49._12_4_ = fVar92;
    auVar49._16_4_ = fVar94;
    auVar49._20_4_ = fVar96;
    auVar49._24_4_ = fVar98;
    auVar49._28_4_ = fStack_13e4;
    auVar62._16_8_ = uStack_1690;
    auVar62._0_16_ = auVar12;
    auVar62._24_8_ = uStack_1688;
    auVar82 = vfmadd213ps_fma(ZEXT1632(auVar82),auVar49,auVar62);
    auVar50._4_4_ = fVar88;
    auVar50._0_4_ = fVar86;
    auVar50._8_4_ = fVar90;
    auVar50._12_4_ = fVar92;
    auVar50._16_4_ = fVar94;
    auVar50._20_4_ = fVar96;
    auVar50._24_4_ = fVar98;
    auVar50._28_4_ = fStack_13e4;
    auVar55._16_8_ = uStack_14d0;
    auVar55._0_16_ = auVar19;
    auVar55._24_8_ = uStack_14c8;
    auVar57._16_8_ = uStack_1550;
    auVar57._0_16_ = auVar17;
    auVar57._24_8_ = uStack_1548;
    auVar8 = vfmadd213ps_fma(auVar55,auVar50,auVar57);
    auVar51._4_4_ = fVar88;
    auVar51._0_4_ = fVar86;
    auVar51._8_4_ = fVar90;
    auVar51._12_4_ = fVar92;
    auVar51._16_4_ = fVar94;
    auVar51._20_4_ = fVar96;
    auVar51._24_4_ = fVar98;
    auVar51._28_4_ = fStack_13e4;
    auVar59._16_8_ = uStack_15d0;
    auVar59._0_16_ = auVar15;
    auVar59._24_8_ = uStack_15c8;
    auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar51,auVar59);
    auVar52._4_4_ = fVar88;
    auVar52._0_4_ = fVar86;
    auVar52._8_4_ = fVar90;
    auVar52._12_4_ = fVar92;
    auVar52._16_4_ = fVar94;
    auVar52._20_4_ = fVar96;
    auVar52._24_4_ = fVar98;
    auVar52._28_4_ = fStack_13e4;
    auVar61._16_8_ = uStack_1650;
    auVar61._0_16_ = auVar13;
    auVar61._24_8_ = uStack_1648;
    auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar52,auVar61);
    auVar53._4_4_ = fVar88;
    auVar53._0_4_ = fVar86;
    auVar53._8_4_ = fVar90;
    auVar53._12_4_ = fVar92;
    auVar53._16_4_ = fVar94;
    auVar53._20_4_ = fVar96;
    auVar53._24_4_ = fVar98;
    auVar53._28_4_ = fStack_13e4;
    auVar63._16_8_ = uStack_16d0;
    auVar63._0_16_ = auVar11;
    auVar63._24_8_ = uStack_16c8;
    auVar8 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar53,auVar63);
    auVar54._4_4_ = fVar87;
    auVar54._0_4_ = fVar85;
    auVar54._8_4_ = fVar89;
    auVar54._12_4_ = fVar91;
    auVar54._16_4_ = fVar93;
    auVar54._20_4_ = fVar95;
    auVar54._24_4_ = fVar97;
    auVar54._28_4_ = fStack_13e4;
    auVar82 = vfmadd213ps_fma(ZEXT1632(auVar82),auVar54,ZEXT1632(auVar8));
    local_1480 = auVar82._0_4_;
    fStack_147c = auVar82._4_4_;
    fStack_1478 = auVar82._8_4_;
    fStack_1474 = auVar82._12_4_;
    auVar35._16_8_ = uStack_1710;
    auVar35._0_16_ = auVar10;
    auVar35._24_8_ = uStack_1708;
    auVar2 = vpand_avx2(auVar2,auVar35);
    local_1860 = auVar2._0_4_;
    fStack_185c = auVar2._4_4_;
    fStack_1858 = auVar2._8_4_;
    fStack_1854 = auVar2._12_4_;
    fStack_1850 = auVar2._16_4_;
    fStack_184c = auVar2._20_4_;
    fStack_1848 = auVar2._24_4_;
    fStack_1844 = auVar2._28_4_;
    auVar38._4_4_ = fStack_147c * fStack_13fc + fStack_185c;
    auVar38._0_4_ = local_1480 * local_1400 + local_1860;
    auVar38._8_4_ = fStack_1478 * fStack_13f8 + fStack_1858;
    auVar38._12_4_ = fStack_1474 * fStack_13f4 + fStack_1854;
    auVar38._16_4_ = fStack_13f0 * 0.0 + fStack_1850;
    auVar38._20_4_ = fStack_13ec * 0.0 + fStack_184c;
    auVar38._24_4_ = fStack_13e8 * 0.0 + fStack_1848;
    auVar38._28_4_ = fStack_13e4 + fStack_1844;
    auVar2 = vpor_avx2(auVar38,auVar25);
    local_20e0 = auVar2._0_4_;
    fStack_20dc = auVar2._4_4_;
    fStack_20d8 = auVar2._8_4_;
    fStack_20d4 = auVar2._12_4_;
    fStack_20d0 = auVar2._16_4_;
    fStack_20cc = auVar2._20_4_;
    fStack_20c8 = auVar2._24_4_;
    fStack_20c4 = auVar2._28_4_;
    local_2100 = auVar24._0_4_;
    fStack_20fc = auVar24._4_4_;
    fStack_20f8 = auVar24._8_4_;
    fStack_20f4 = auVar24._12_4_;
    fStack_20f0 = auVar24._16_4_;
    fStack_20ec = auVar24._20_4_;
    fStack_20e8 = auVar24._24_4_;
    fStack_20e4 = auVar24._28_4_;
    auVar32._16_8_ = uStack_2010;
    auVar32._0_16_ = auVar6;
    auVar32._24_8_ = uStack_2008;
    auVar2 = vpor_avx2(auVar22,auVar32);
    auVar22._16_8_ = uStack_2090;
    auVar22._0_16_ = auVar4;
    auVar22._24_8_ = uStack_2088;
    auVar2 = vcmpps_avx(auVar2,auVar22,1);
    auVar31._16_8_ = uStack_1fd0;
    auVar31._0_16_ = auVar7;
    auVar31._24_8_ = uStack_1fc8;
    auVar83 = vpor_avx2(auVar23,auVar31);
    auVar83 = vpand_avx2(auVar3,auVar83);
    auVar24._16_8_ = uStack_2010;
    auVar24._0_16_ = auVar6;
    auVar24._24_8_ = uStack_2008;
    auVar22 = vpand_avx2(auVar2,auVar24);
    auVar41._16_8_ = uStack_2090;
    auVar41._0_16_ = auVar4;
    auVar41._24_8_ = uStack_2088;
    auVar2 = vpandn_avx2(auVar2,auVar41);
    auVar2 = vpor_avx2(auVar22,auVar2);
    auVar2 = vpandn_avx2(auVar3,auVar2);
    auVar3 = vpor_avx2(auVar83,auVar2);
    auVar23._4_4_ = fStack_20dc + fStack_20fc;
    auVar23._0_4_ = local_20e0 + local_2100;
    auVar23._12_4_ = fStack_20d4 + fStack_20f4;
    auVar23._8_4_ = fStack_20d8 + fStack_20f8;
    auVar23._20_4_ = fStack_20cc + fStack_20ec;
    auVar23._16_4_ = fStack_20d0 + fStack_20f0;
    auVar23._28_4_ = fStack_20c4 + fStack_20e4;
    auVar23._24_4_ = fStack_20c8 + fStack_20e8;
    auVar2 = vpand_avx2(auVar21,auVar23);
    auVar83 = vpternlogq_avx512vl(auVar21,auVar21,auVar21,0xf);
    auVar3 = vpand_avx2(auVar83,auVar3);
    auVar2 = vpor_avx2(auVar2,auVar3);
    local_2620 = auVar2._0_8_;
    uStackY_2618 = auVar2._8_8_;
    uStackY_2610 = auVar2._16_8_;
    uStackY_2608 = auVar2._24_8_;
    *(undefined8 *)*local_24e0 = local_2620;
    *(undefined8 *)(*local_24e0 + 8) = uStackY_2618;
    *(undefined8 *)(*local_24e0 + 0x10) = uStackY_2610;
    *(undefined8 *)(*local_24e0 + 0x18) = uStackY_2608;
    local_24d0 = local_24d0 + 1;
    local_24e0 = (undefined1 (*) [64])(*local_24e0 + 0x20);
  }
  uVar1 = *in_RSI;
  uVar29 = CONCAT44(uVar1,uVar1);
  uVar30 = CONCAT44(uVar1,uVar1);
  for (; local_24f4 + 3 < iVar81; local_24f4 = local_24f4 + 4) {
    auVar43._8_8_ = uVar30;
    auVar43._0_8_ = uVar29;
    auVar42._8_8_ = uVar30;
    auVar42._0_8_ = uVar29;
    auVar20._8_8_ = uVar30;
    auVar20._0_8_ = uVar29;
    auVar5._8_8_ = uVar30;
    auVar5._0_8_ = uVar29;
    auVar4 = vcmpps_avx(*(undefined1 (*) [16])*local_24d0,ZEXT816(0),4);
    auVar5 = vcmpps_avx(auVar5,ZEXT816(0),4);
    auVar6 = vpand_avx(auVar4,auVar5);
    auVar8._8_8_ = 0x8000000080000000;
    auVar8._0_8_ = 0x8000000080000000;
    auVar7 = vpand_avx(auVar8,*(undefined1 (*) [16])*local_24d0);
    auVar82._8_8_ = 0x8000000080000000;
    auVar82._0_8_ = 0x8000000080000000;
    auVar8 = vpand_avx(auVar82,auVar20);
    auVar4 = vcmpps_avx(*(undefined1 (*) [16])*local_24d0,ZEXT816(0),1);
    auVar82 = vcmpps_avx(auVar42,ZEXT816(0),1);
    auVar9._8_8_ = 0x8000000080000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar82 = vpand_avx(auVar82,auVar9);
    auVar12._8_8_ = 0x40490fdb40490fdb;
    auVar12._0_8_ = 0x40490fdb40490fdb;
    auVar82 = vpor_avx(auVar82,auVar12);
    auVar9 = vpand_avx(auVar4,auVar82);
    auVar4 = vdivps_avx(auVar43,*(undefined1 (*) [16])*local_24d0);
    auVar15._8_8_ = 0x8000000080000000;
    auVar15._0_8_ = 0x8000000080000000;
    auVar10 = vpand_avx(auVar15,auVar4);
    auVar19._8_8_ = 0x8000000080000000;
    auVar19._0_8_ = 0x8000000080000000;
    auVar11 = vpandn_avx(auVar19,auVar4);
    auVar17._8_8_ = 0x3f8000003f800000;
    auVar17._0_8_ = 0x3f8000003f800000;
    auVar4 = vcmpps_avx(auVar17,auVar11,1);
    auVar14._8_8_ = 0xbf800000bf800000;
    auVar14._0_8_ = 0xbf800000bf800000;
    auVar82 = vpand_avx(auVar4,auVar14);
    auVar12 = vpandn_avx(auVar4,auVar11);
    auVar12 = vpor_avx(auVar82,auVar12);
    auVar82 = vpand_avx(auVar4,auVar11);
    auVar18._8_8_ = 0x3f8000003f800000;
    auVar18._0_8_ = 0x3f8000003f800000;
    auVar11 = vpandn_avx(auVar4,auVar18);
    auVar82 = vpor_avx(auVar82,auVar11);
    auVar82 = vdivps_avx(auVar12,auVar82);
    local_630 = auVar82._0_4_;
    fStack_62c = auVar82._4_4_;
    fStack_628 = auVar82._8_4_;
    fStack_624 = auVar82._12_4_;
    fVar85 = local_630 * local_630;
    fVar87 = fStack_62c * fStack_62c;
    fVar89 = fStack_628 * fStack_628;
    fVar91 = fStack_624 * fStack_624;
    fVar86 = fVar85 * fVar85;
    fVar88 = fVar87 * fVar87;
    fVar90 = fVar89 * fVar89;
    fVar92 = fVar91 * fVar91;
    auVar64._4_4_ = fVar88;
    auVar64._0_4_ = fVar86;
    auVar64._8_4_ = fVar90;
    auVar64._12_4_ = fVar92;
    auVar73._8_8_ = 0xbc83a25cbc83a25c;
    auVar73._0_8_ = 0xbc83a25cbc83a25c;
    auVar75._8_8_ = 0xbd99b01ebd99b01e;
    auVar75._0_8_ = 0xbd99b01ebd99b01e;
    auVar82 = vfmadd213ps_fma(auVar73,auVar64,auVar75);
    auVar65._4_4_ = fVar88;
    auVar65._0_4_ = fVar86;
    auVar65._8_4_ = fVar90;
    auVar65._12_4_ = fVar92;
    auVar77._8_8_ = 0xbe117200be117200;
    auVar77._0_8_ = 0xbe117200be117200;
    auVar82 = vfmadd213ps_fma(auVar82,auVar65,auVar77);
    auVar66._4_4_ = fVar88;
    auVar66._0_4_ = fVar86;
    auVar66._8_4_ = fVar90;
    auVar66._12_4_ = fVar92;
    auVar79._8_8_ = 0xbeaaaa53beaaaa53;
    auVar79._0_8_ = 0xbeaaaa53beaaaa53;
    auVar82 = vfmadd213ps_fma(auVar82,auVar66,auVar79);
    auVar67._4_4_ = fVar88;
    auVar67._0_4_ = fVar86;
    auVar67._8_4_ = fVar90;
    auVar67._12_4_ = fVar92;
    auVar72._8_8_ = 0x3b3ac5373b3ac537;
    auVar72._0_8_ = 0x3b3ac5373b3ac537;
    auVar74._8_8_ = 0x3d2edd4e3d2edd4e;
    auVar74._0_8_ = 0x3d2edd4e3d2edd4e;
    auVar11 = vfmadd213ps_fma(auVar72,auVar67,auVar74);
    auVar68._4_4_ = fVar88;
    auVar68._0_4_ = fVar86;
    auVar68._8_4_ = fVar90;
    auVar68._12_4_ = fVar92;
    auVar76._8_8_ = 0x3dd9ed243dd9ed24;
    auVar76._0_8_ = 0x3dd9ed243dd9ed24;
    auVar11 = vfmadd213ps_fma(auVar11,auVar68,auVar76);
    auVar69._4_4_ = fVar88;
    auVar69._0_4_ = fVar86;
    auVar69._8_4_ = fVar90;
    auVar69._12_4_ = fVar92;
    auVar78._8_8_ = 0x3e4cb9743e4cb974;
    auVar78._0_8_ = 0x3e4cb9743e4cb974;
    auVar11 = vfmadd213ps_fma(auVar11,auVar69,auVar78);
    auVar70._4_4_ = fVar88;
    auVar70._0_4_ = fVar86;
    auVar70._8_4_ = fVar90;
    auVar70._12_4_ = fVar92;
    auVar80._8_8_ = 0x3f8000003f800000;
    auVar80._0_8_ = 0x3f8000003f800000;
    auVar11 = vfmadd213ps_fma(auVar11,auVar70,auVar80);
    auVar71._4_4_ = fVar87;
    auVar71._0_4_ = fVar85;
    auVar71._8_4_ = fVar89;
    auVar71._12_4_ = fVar91;
    auVar82 = vfmadd213ps_fma(auVar82,auVar71,auVar11);
    local_670 = auVar82._0_4_;
    fStack_66c = auVar82._4_4_;
    fStack_668 = auVar82._8_4_;
    fStack_664 = auVar82._12_4_;
    auVar13._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar13._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar4 = vpand_avx(auVar4,auVar13);
    local_6a0 = auVar4._0_4_;
    fStack_69c = auVar4._4_4_;
    fStack_698 = auVar4._8_4_;
    fStack_694 = auVar4._12_4_;
    auVar16._4_4_ = fStack_66c * fStack_62c + fStack_69c;
    auVar16._0_4_ = local_670 * local_630 + local_6a0;
    auVar16._8_4_ = fStack_668 * fStack_628 + fStack_698;
    auVar16._12_4_ = fStack_664 * fStack_624 + fStack_694;
    auVar4 = vpor_avx(auVar16,auVar10);
    local_b80 = auVar4._0_4_;
    fStack_b7c = auVar4._4_4_;
    fStack_b78 = auVar4._8_4_;
    fStack_b74 = auVar4._12_4_;
    local_b90 = auVar9._0_4_;
    fStack_b8c = auVar9._4_4_;
    fStack_b88 = auVar9._8_4_;
    fStack_b84 = auVar9._12_4_;
    auVar11._8_8_ = 0x40490fdb40490fdb;
    auVar11._0_8_ = 0x40490fdb40490fdb;
    auVar4 = vpor_avx(auVar7,auVar11);
    auVar4 = vcmpps_avx(auVar4,ZEXT816(0),1);
    auVar10._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar10._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar82 = vpor_avx(auVar8,auVar10);
    auVar82 = vpand_avx(auVar5,auVar82);
    auVar7._8_8_ = 0x40490fdb40490fdb;
    auVar7._0_8_ = 0x40490fdb40490fdb;
    auVar7 = vpand_avx(auVar4,auVar7);
    auVar4 = vpandn_avx(auVar4,ZEXT816(0));
    auVar4 = vpor_avx(auVar7,auVar4);
    auVar4 = vpandn_avx(auVar5,auVar4);
    auVar5 = vpor_avx(auVar82,auVar4);
    auVar4._4_4_ = fStack_b7c + fStack_b8c;
    auVar4._0_4_ = local_b80 + local_b90;
    auVar4._12_4_ = fStack_b74 + fStack_b84;
    auVar4._8_4_ = fStack_b78 + fStack_b88;
    auVar4 = vpand_avx(auVar6,auVar4);
    auVar82 = vpternlogq_avx512vl(auVar6,auVar6,auVar6,0xf);
    auVar5 = vpand_avx(auVar82,auVar5);
    auVar4 = vpor_avx(auVar4,auVar5);
    local_2650 = auVar4._0_8_;
    uStackY_2648 = auVar4._8_8_;
    *(undefined8 *)*local_24e0 = local_2650;
    *(undefined8 *)(*local_24e0 + 8) = uStackY_2648;
    local_24d0 = (undefined1 (*) [32])(*local_24d0 + 0x10);
    local_24e0 = (undefined1 (*) [64])(*local_24e0 + 0x10);
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}